

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

void duckdb::TestVectorSequence::Generate(TestVectorInfo *info)

{
  vector<duckdb::LogicalType,_true> *this;
  pointer pDVar1;
  Allocator *allocator;
  const_reference pvVar2;
  reference result_00;
  idx_t c;
  ulong __n;
  templated_unique_single_t result;
  
  make_uniq<duckdb::DataChunk>();
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&result);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(pDVar1,allocator,info->types,0x800);
  for (__n = 0; this = info->types,
      __n < (ulong)(((long)(this->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1) {
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(this,__n);
    if (pvVar2->id_ == MAP) goto LAB_0086f49f;
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(info->types,__n);
    pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (&result);
    result_00 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,__n);
    GenerateVector(info,pvVar2,result_00);
  }
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&result);
  pDVar1->count = 3;
  ::std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
            ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
              *)info->entries,&result);
LAB_0086f49f:
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            (&result.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
  return;
}

Assistant:

static void Generate(TestVectorInfo &info) {
		static constexpr const idx_t SEQ_CARDINALITY = 3;

		auto result = make_uniq<DataChunk>();
		result->Initialize(Allocator::DefaultAllocator(), info.types,
		                   MaxValue<idx_t>(SEQ_CARDINALITY, STANDARD_VECTOR_SIZE));

		for (idx_t c = 0; c < info.types.size(); c++) {
			if (info.types[c].id() == LogicalTypeId::MAP) {
				// FIXME: we don't support MAP in the TestVectorSequence
				return;
			}
			GenerateVector(info, info.types[c], result->data[c]);
		}
		result->SetCardinality(SEQ_CARDINALITY);
#if STANDARD_VECTOR_SIZE > 2
		info.entries.push_back(std::move(result));
#else
		// vsize = 2, split into two smaller data chunks
		for (idx_t offset = 0; offset < SEQ_CARDINALITY; offset += STANDARD_VECTOR_SIZE) {
			auto new_result = make_uniq<DataChunk>();
			new_result->Initialize(Allocator::DefaultAllocator(), info.types);

			idx_t copy_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, SEQ_CARDINALITY - offset);
			result->Copy(*new_result, *FlatVector::IncrementalSelectionVector(), offset + copy_count, offset);

			info.entries.push_back(std::move(new_result));
		}
#endif
	}